

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_move.h
# Opt level: O3

bool __thiscall hanabi_learning_env::HanabiMove::operator==(HanabiMove *this,HanabiMove *other_move)

{
  if (this->move_type_ != other_move->move_type_) {
    return false;
  }
  switch(this->move_type_) {
  case kPlay:
  case kDiscard:
    return this->card_index_ == other_move->card_index_;
  case kRevealColor:
    if (this->target_offset_ == other_move->target_offset_) {
      return this->color_ == other_move->color_;
    }
    return false;
  case kRevealRank:
    if (this->target_offset_ != other_move->target_offset_) {
      return false;
    }
    break;
  case kDeal:
    if (this->color_ != other_move->color_) {
      return false;
    }
    break;
  default:
    return true;
  }
  return this->rank_ == other_move->rank_;
}

Assistant:

int8_t TargetOffset() const { return target_offset_; }